

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tvrq_api.c
# Opt level: O1

int RqOutGetMemSizes(int nOutSymNum,size_t *pOutWorkMemSize,size_t *pOutProgMemSize)

{
  size_t sVar1;
  
  sVar1 = (long)nOutSymNum * 4 + 0x34;
  if (pOutWorkMemSize != (size_t *)0x0) {
    *pOutWorkMemSize = sVar1;
  }
  if (pOutProgMemSize != (size_t *)0x0) {
    *pOutProgMemSize = sVar1;
  }
  return 0;
}

Assistant:

int RqOutGetMemSizes(int nOutSymNum,
		     size_t* pOutWorkMemSize,
		     size_t* pOutProgMemSize)
{
	_Static_assert(sizeof(RqOutWorkMem) == sizeof(RqOutProgram),
			"RqOutWorkMem and RqOutProgram need to be defined identically.");
	const size_t sz = sizeof(RqOutWorkMem) + nOutSymNum*sizeof(uint32_t);
	if (pOutWorkMemSize != NULL) {
		*pOutWorkMemSize = sz;
	}
	if (pOutProgMemSize != NULL) {
		*pOutProgMemSize = sz;
	}
	return 0;
}